

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo3.cpp
# Opt level: O3

int64_t primecount::pi_lmo3(int64_t x)

{
  int iVar1;
  int iVar2;
  double dVar3;
  undefined1 x_00 [16];
  int *piVar4;
  bool *__s;
  long *plVar5;
  bool bVar6;
  ulong c;
  ulong uVar7;
  int64_t iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long res;
  ulong uVar15;
  long lVar16;
  int64_t m;
  long lVar17;
  long lVar18;
  long lVar19;
  size_t n;
  bool *pbVar20;
  type primes;
  Vector<bool,_std::allocator<bool>_> sieve;
  Vector<long,_std::allocator<long>_> next;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  double dVar21;
  long *plVar22;
  Vector<int,_std::allocator<int>_> local_138;
  long local_120;
  long local_118;
  int64_t local_110;
  Vector<bool,_std::allocator<bool>_> local_108;
  Vector<long,_std::allocator<long>_> local_e8;
  ulong local_c8;
  int64_t local_c0;
  size_t local_b8;
  long local_b0;
  long local_a8;
  bool *local_a0;
  size_t local_98;
  long local_90;
  ulong local_88;
  long local_80;
  Vector<int,_std::allocator<int>_> local_78;
  Vector<int,_std::allocator<int>_> local_60;
  Vector<long,_std::allocator<long>_> local_48;
  
  if (x < 2) {
    iVar8 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffea0;
    x_00._0_8_ = in_stack_fffffffffffffe98;
    dVar21 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar3 = cbrt((double)x);
    uVar15 = (ulong)dVar3;
    if (0 < (long)uVar15) {
      do {
        if (uVar15 * uVar15 - (ulong)x / uVar15 == 0 ||
            (long)(uVar15 * uVar15) < (long)((ulong)x / uVar15)) goto LAB_0011a03e;
        bVar6 = 1 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar6);
      uVar15 = 0;
    }
LAB_0011a03e:
    lVar16 = uVar15 - 1;
    do {
      lVar9 = lVar16 + 2;
      lVar16 = lVar16 + 1;
    } while (lVar9 * lVar9 - x / lVar9 == 0 || lVar9 * lVar9 < x / lVar9);
    uVar15 = (ulong)(dVar21 * (double)lVar16);
    c = 8;
    if (uVar15 < 0x14) {
      c = (ulong)(byte)(&PhiTiny::pi)[uVar15];
    }
    generate_primes_i32(&local_138,uVar15);
    generate_lpf(&local_60,uVar15);
    generate_moebius(&local_78,uVar15);
    lVar16 = (long)local_138.end_ - (long)local_138.array_;
    bVar6 = is_print();
    lVar16 = (lVar16 >> 2) + -1;
    uVar7 = P2(x,uVar15,lVar16,1,bVar6);
    bVar6 = is_print();
    iVar8 = S1(x,uVar15,c,1,bVar6);
    lVar9 = x / (long)uVar15;
    dVar21 = (double)lVar9;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    n = 0xb504f333;
    if ((long)dVar21 < 0xb504f333) {
      n = (long)dVar21;
    }
    if (lVar9 < (long)(n * n)) {
      do {
        n = n - 1;
      } while (n * n - lVar9 != 0 && lVar9 <= (long)(n * n));
    }
    else {
      lVar10 = n * 2;
      if (lVar10 < (long)(lVar9 - n * n)) {
        do {
          n = n + 1;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)(lVar9 - n * n));
      }
    }
    local_108.array_ = (bool *)0x0;
    local_108.end_ = (bool *)0x0;
    local_108.capacity_ = (bool *)0x0;
    Vector<bool,_std::allocator<bool>_>::resize(&local_108,n);
    local_e8.array_ = (long *)0x0;
    local_e8.end_ = (long *)0x0;
    local_e8.capacity_ = (long *)0x0;
    Vector<long,_std::allocator<long>_>::resize
              (&local_e8,(long)local_138.end_ - (long)local_138.array_ >> 2);
    local_48.array_ = (long *)0x0;
    local_48.end_ = (long *)0x0;
    local_48.capacity_ = (long *)0x0;
    local_c0 = iVar8;
    Vector<long,_std::allocator<long>_>::resize
              (&local_48,(long)local_138.end_ - (long)local_138.array_ >> 2);
    plVar22 = local_48.array_;
    plVar5 = local_e8.array_;
    piVar4 = local_138.array_;
    lVar10 = (long)local_138.end_ - (long)local_138.array_ >> 2;
    if (0 < lVar10) {
      uVar11 = lVar10 + 1;
      lVar10 = 0;
      do {
        *(long *)((long)local_e8.array_ + lVar10 * 2) =
             (long)*(int *)((long)local_138.array_ + lVar10);
        uVar11 = uVar11 - 1;
        lVar10 = lVar10 + 4;
      } while (1 < uVar11);
    }
    if (local_48.array_ != local_48.end_) {
      memset(local_48.array_,0,(long)local_48.end_ - (long)local_48.array_ & 0xfffffffffffffff8);
    }
    __s = local_108.array_;
    local_c8 = uVar7;
    if (lVar9 < 2) {
      local_120 = 0;
    }
    else {
      local_a0 = local_108.end_;
      local_b8 = (long)local_108.end_ - (long)local_108.array_;
      local_a8 = c + 1;
      pbVar20 = local_108.array_ + -1;
      local_b0 = -n;
      local_90 = 1;
      local_120 = 0;
      local_110 = x;
      local_98 = n;
      local_88 = uVar15;
      local_80 = lVar16;
      do {
        lVar10 = local_90 + local_98;
        lVar19 = lVar10;
        if (lVar9 < lVar10) {
          lVar19 = lVar9;
        }
        local_118 = local_90;
        if (__s != local_a0) {
          local_90 = lVar10;
          memset(__s,1,local_b8);
          lVar10 = local_90;
        }
        local_90 = lVar10;
        if (c != 0) {
          uVar7 = 1;
          do {
            lVar10 = plVar5[uVar7];
            if (lVar10 < lVar19) {
              iVar1 = piVar4[uVar7];
              do {
                pbVar20[lVar10] = false;
                lVar10 = lVar10 + iVar1;
              } while (lVar10 < lVar19);
            }
            plVar5[uVar7] = lVar10;
            bVar6 = uVar7 != c;
            uVar7 = uVar7 + 1;
          } while (bVar6);
        }
        if (local_a8 < lVar16) {
          lVar10 = local_a8;
          do {
            iVar1 = piVar4[lVar10];
            lVar17 = (long)iVar1;
            lVar12 = x / (lVar19 * lVar17);
            lVar14 = (long)uVar15 / lVar17;
            if ((long)uVar15 / lVar17 < lVar12) {
              lVar14 = lVar12;
            }
            uVar7 = x / (local_118 * lVar17);
            if ((long)uVar15 <= (long)uVar7) {
              uVar7 = uVar15;
            }
            if ((long)uVar7 <= lVar17) break;
            if (lVar14 < (long)uVar7) {
              lVar16 = 0;
              do {
                iVar2 = local_78.array_[uVar7];
                if (((long)iVar2 != 0) && (iVar1 < local_60.array_[uVar7])) {
                  lVar13 = local_110 / (long)(uVar7 * lVar17) - local_118;
                  lVar12 = plVar22[lVar10];
                  lVar18 = lVar16;
                  if (lVar16 <= lVar13) {
                    do {
                      lVar12 = lVar12 + (ulong)__s[lVar18];
                      lVar16 = lVar18 + 1;
                      bVar6 = lVar18 < lVar13;
                      lVar18 = lVar16;
                    } while (bVar6);
                    plVar22[lVar10] = lVar12;
                  }
                  local_120 = local_120 - lVar12 * iVar2;
                }
                uVar7 = uVar7 - 1;
              } while (lVar14 < (long)uVar7);
            }
            else {
              lVar16 = 0;
            }
            if (lVar16 < lVar19 - local_118) {
              lVar14 = plVar22[lVar10];
              do {
                lVar14 = lVar14 + (ulong)__s[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 < lVar19 - local_118);
              plVar22[lVar10] = lVar14;
            }
            lVar16 = plVar5[lVar10];
            if (lVar16 < lVar19) {
              do {
                pbVar20[lVar16] = false;
                lVar16 = lVar16 + lVar17 * 2;
              } while (lVar16 < lVar19);
            }
            plVar5[lVar10] = lVar16;
            lVar10 = lVar10 + 1;
            x = local_110;
            uVar15 = local_88;
            lVar16 = local_80;
          } while (lVar10 != local_80);
        }
        pbVar20 = pbVar20 + local_b0;
      } while (local_90 < lVar9);
    }
    operator_delete(plVar22,(long)local_48.capacity_ - (long)plVar22);
    operator_delete(local_e8.array_,(long)local_e8.capacity_ - (long)local_e8.array_);
    operator_delete(local_108.array_,(long)local_108.capacity_ - (long)local_108.array_);
    iVar8 = local_c0 + local_120 + lVar16 + ~local_c8;
    operator_delete(local_78.array_,(long)local_78.capacity_ - (long)local_78.array_);
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_138.array_,(long)local_138.capacity_ - (long)local_138.array_);
  }
  return iVar8;
}

Assistant:

int64_t pi_lmo3(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}